

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O3

int CVodeQuadInit(void *cvode_mem,CVQuadRhsFn fQ,N_Vector yQ0)

{
  bool bVar1;
  undefined8 *puVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int error_code;
  char *msgfmt;
  undefined8 *puVar6;
  undefined8 *puVar7;
  int iVar8;
  sunindextype liw1Q;
  sunindextype lrw1Q;
  undefined8 local_38;
  undefined8 local_30;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar8 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    iVar3 = 0x48e;
  }
  else {
    N_VSpace(yQ0,&local_30,&local_38);
    *(undefined8 *)((long)cvode_mem + 0x708) = local_30;
    *(undefined8 *)((long)cvode_mem + 0x710) = local_38;
    lVar4 = N_VClone(yQ0);
    *(long *)((long)cvode_mem + 0x268) = lVar4;
    if (lVar4 != 0) {
      puVar7 = (undefined8 *)((long)cvode_mem + 0x268);
      lVar4 = N_VClone(yQ0);
      *(long *)((long)cvode_mem + 0x278) = lVar4;
      if (lVar4 != 0) {
        lVar4 = N_VClone(yQ0);
        *(long *)((long)cvode_mem + 0x270) = lVar4;
        puVar6 = puVar7;
        puVar2 = (undefined8 *)((long)cvode_mem + 0x278);
        if (lVar4 != 0) {
          lVar4 = N_VClone(yQ0);
          *(long *)((long)cvode_mem + 0x280) = lVar4;
          if (lVar4 != 0) {
            iVar3 = *(int *)((long)cvode_mem + 0x598);
            if (-1 < iVar3) {
              lVar4 = 0;
              do {
                lVar5 = N_VClone(yQ0);
                *(long *)((long)cvode_mem + lVar4 * 8 + 0x200) = lVar5;
                if (lVar5 == 0) {
                  N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x268));
                  N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x278));
                  N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x270));
                  N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x280));
                  if (lVar4 != 0) {
                    lVar5 = 0;
                    do {
                      N_VDestroy(*(undefined8 *)((long)cvode_mem + lVar5 * 8 + 0x200));
                      lVar5 = lVar5 + 1;
                    } while (lVar4 != lVar5);
                  }
                  goto LAB_00113dff;
                }
                iVar3 = *(int *)((long)cvode_mem + 0x598);
                bVar1 = lVar4 < iVar3;
                lVar4 = lVar4 + 1;
              } while (bVar1);
            }
            *(int *)((long)cvode_mem + 0x834) = iVar3;
            *(long *)((long)cvode_mem + 0x718) =
                 *(long *)((long)cvode_mem + 0x718) +
                 *(long *)((long)cvode_mem + 0x708) * (long)(iVar3 + 5);
            *(long *)((long)cvode_mem + 0x720) =
                 *(long *)((long)cvode_mem + 0x720) +
                 (long)(iVar3 + 5) * *(long *)((long)cvode_mem + 0x710);
            N_VScale(0x3ff0000000000000,yQ0,*(undefined8 *)((long)cvode_mem + 0x200));
            *(CVQuadRhsFn *)((long)cvode_mem + 0x60) = fQ;
            *(undefined8 *)((long)cvode_mem + 0x638) = 0;
            *(undefined8 *)((long)cvode_mem + 0x6b0) = 0;
            *(undefined4 *)((long)cvode_mem + 0x5c) = 1;
            *(undefined4 *)((long)cvode_mem + 0x854) = 1;
            return 0;
          }
          N_VDestroy(*puVar7);
          puVar6 = (undefined8 *)((long)cvode_mem + 0x278);
          puVar2 = (undefined8 *)((long)cvode_mem + 0x270);
        }
        puVar7 = puVar2;
        N_VDestroy(*puVar6);
      }
      N_VDestroy(*puVar7);
    }
LAB_00113dff:
    msgfmt = "A memory request failed.";
    iVar8 = -0x14;
    error_code = -0x14;
    iVar3 = 0x49c;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar3,"CVodeQuadInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes.c"
                 ,msgfmt);
  return iVar8;
}

Assistant:

int CVodeQuadInit(void* cvode_mem, CVQuadRhsFn fQ, N_Vector yQ0)
{
  CVodeMem cv_mem;
  sunbooleantype allocOK;
  sunindextype lrw1Q, liw1Q;

  /* Check cvode_mem */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Set space requirements for one N_Vector */
  N_VSpace(yQ0, &lrw1Q, &liw1Q);
  cv_mem->cv_lrw1Q = lrw1Q;
  cv_mem->cv_liw1Q = liw1Q;

  /* Allocate the vectors (using yQ0 as a template) */
  allocOK = cvQuadAllocVectors(cv_mem, yQ0);
  if (!allocOK)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  /* Initialize znQ[0] in the history array */
  N_VScale(ONE, yQ0, cv_mem->cv_znQ[0]);

  /* Copy the input parameters into CVODES state */
  cv_mem->cv_fQ = fQ;

  /* Initialize counters */
  cv_mem->cv_nfQe  = 0;
  cv_mem->cv_netfQ = 0;

  /* Quadrature integration turned ON */
  cv_mem->cv_quadr          = SUNTRUE;
  cv_mem->cv_QuadMallocDone = SUNTRUE;

  /* Quadrature initialization was successful */
  return (CV_SUCCESS);
}